

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O3

int fits_translate_pixkeyword
              (char *inrec,char *outrec,char *(*patterns) [2],int npat,int naxis,int *colnum,
              int *pat_num,int *i,int *j,int *n,int *m,int *l,int *status)

{
  byte *pbVar1;
  bool bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  ushort **ppuVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  byte *pbVar12;
  int iVar13;
  long lVar14;
  byte bVar15;
  bool bVar16;
  byte local_8a;
  byte local_89;
  uint local_88;
  int local_84;
  int local_80;
  uint local_7c;
  int local_74;
  int local_70;
  
  iVar10 = *status;
  if (iVar10 < 1) {
    if (inrec == (char *)0x0 || outrec == (char *)0x0) {
      *status = 0x73;
      iVar10 = 0x73;
    }
    else {
      *outrec = '\0';
      if (*inrec == '\0') {
        iVar10 = 0;
      }
      else {
        local_89 = 0x20;
        if (npat < 1) {
          bVar16 = true;
          local_7c = 0;
          local_80 = 0;
          local_84 = 0;
          local_70 = 0;
          local_74 = 0;
          local_88 = 0;
          local_8a = local_89;
        }
        else {
          uVar8 = 0;
          bVar2 = false;
          local_88 = 0;
          local_74 = 0;
          local_70 = 0;
          bVar5 = 0;
          do {
            pbVar1 = (byte *)patterns[uVar8][0];
            bVar4 = *pbVar1;
            local_7c = (uint)uVar8;
            if (bVar4 == 0x2a) {
              local_80 = 0;
              local_84 = 0;
              bVar16 = false;
              local_8a = local_89;
              break;
            }
            bVar16 = true;
            local_8a = 0x20;
            if ((bVar2) && (local_80 = 0, bVar4 == bVar5)) {
              local_84 = 0;
              bVar4 = bVar5;
              bVar2 = true;
            }
            else if (bVar4 == 0) {
              local_80 = 0;
              local_84 = 0;
              bVar4 = 0;
              bVar2 = true;
            }
            else {
              local_8a = 0x20;
              lVar11 = 0;
              bVar2 = true;
              bVar16 = false;
              lVar9 = 0;
              local_84 = 0;
              local_80 = 0;
              bVar5 = bVar4;
              do {
                iVar13 = (int)lVar9;
                lVar9 = (long)iVar13;
                bVar15 = inrec[lVar9];
                lVar14 = (long)(char)bVar15;
                bVar3 = local_8a;
                iVar10 = local_70;
                if (bVar5 == 0x6a) {
                  ppuVar7 = __ctype_b_loc();
                  if ((*(byte *)((long)*ppuVar7 + lVar14 * 2 + 1) & 8) != 0) {
                    local_84 = (char)bVar15 + -0x30;
                    goto LAB_00132f69;
                  }
LAB_00132f5e:
                  local_70 = iVar10;
                  bVar3 = local_8a;
                  if (!bVar16) {
LAB_0013306b:
                    bVar16 = true;
                    goto LAB_00133092;
                  }
                }
                else {
                  uVar6 = (uint)bVar5;
                  if (uVar6 != 0x69) {
                    if (uVar6 < 0x6c) {
                      if (uVar6 != 0x23) {
                        if (uVar6 != 0x3f) {
                          if (uVar6 != 0x61) goto LAB_00132f01;
                          ppuVar7 = __ctype_b_loc();
                          bVar3 = bVar15;
                          if (((*(byte *)((long)*ppuVar7 + lVar14 * 2 + 1) & 1) == 0) &&
                             (bVar15 != 0x20)) goto LAB_00132f5e;
                        }
                        goto LAB_00132f69;
                      }
LAB_00132e6c:
                      ppuVar7 = __ctype_b_loc();
                      if ((*(byte *)((long)*ppuVar7 + lVar14 * 2 + 1) & 8) != 0) {
                        iVar13 = iVar13 + -1;
                        uVar6 = 0;
                        do {
                          if ((*(byte *)((long)*ppuVar7 + (long)(char)bVar15 * 2 + 1) & 8) == 0)
                          goto LAB_00132ec0;
                          uVar6 = ((int)(char)bVar15 + uVar6 * 10) - 0x30;
                          bVar15 = inrec[lVar9 + 1];
                          lVar9 = lVar9 + 1;
                          iVar13 = iVar13 + 1;
                        } while (lVar9 != 8);
                        iVar13 = 7;
LAB_00132ec0:
                        if (1 < (byte)(bVar5 + 0x93)) {
                          if (bVar5 == 0x6c) {
                            local_88 = uVar6;
                          }
                          goto LAB_00132f69;
                        }
                        if (uVar6 - 1 < 999) {
                          bVar16 = true;
                          if (uVar6 == *colnum) {
                            iVar10 = 1;
                          }
                          else {
                            iVar10 = 2;
                            if ((uVar6 != colnum[1]) && (iVar10 = 3, uVar6 != colnum[2])) {
                              bVar16 = uVar6 == colnum[3];
                              iVar10 = (uint)bVar16 * 4;
                            }
                          }
                          if (bVar5 != 0x6e) {
                            local_74 = iVar10;
                            iVar10 = local_70;
                          }
                          goto LAB_00132f5e;
                        }
                      }
                    }
                    else {
                      if (uVar6 - 0x6c < 3) goto LAB_00132e6c;
LAB_00132f01:
                      if (bVar15 == bVar5) goto LAB_00132f69;
                    }
                    goto LAB_0013306b;
                  }
                  ppuVar7 = __ctype_b_loc();
                  if ((*(byte *)((long)*ppuVar7 + lVar14 * 2 + 1) & 8) == 0) goto LAB_00132f5e;
                  local_80 = (char)bVar15 + -0x30;
                }
LAB_00132f69:
                local_8a = bVar3;
                lVar9 = (long)iVar13 + 1;
                bVar5 = pbVar1[lVar11 + 1];
                if (bVar5 == 0) break;
                lVar11 = lVar11 + 1;
                bVar2 = false;
                bVar16 = true;
              } while (iVar13 < 7);
              if (bVar4 == 0) {
                bVar4 = 0;
                bVar16 = true;
                bVar2 = false;
              }
              else {
                if ((6 < iVar13) || (inrec[lVar9] == ' ')) {
                  bVar16 = false;
                  local_89 = local_8a;
                  local_8a = local_89;
                  break;
                }
                bVar16 = false;
                bVar2 = false;
              }
            }
LAB_00133092:
            uVar8 = uVar8 + 1;
            local_7c = npat;
            bVar5 = bVar4;
          } while (uVar8 != (uint)npat);
        }
        local_89 = local_8a;
        if (i != (int *)0x0) {
          *i = local_80;
        }
        if (j != (int *)0x0) {
          *j = local_84;
        }
        if (n != (int *)0x0) {
          *n = local_70;
        }
        if (m != (int *)0x0) {
          *m = local_74;
        }
        if (l != (int *)0x0) {
          *l = local_88;
        }
        if (pat_num != (int *)0x0) {
          *pat_num = local_7c;
        }
        iVar10 = 0;
        if (!bVar16) {
          pbVar1 = (byte *)patterns[local_7c][1];
          if ((*pbVar1 != 0) && (*pbVar1 != 0x2d)) {
            strcpy(outrec,inrec);
            bVar5 = *pbVar1;
            if (bVar5 != 0x2b) {
              lVar11 = 0;
              iVar10 = 0;
              do {
                if (bVar5 == 0x69) {
                  outrec[iVar10] = (char)local_80 + '0';
                }
                else if (bVar5 == 0x6a) {
                  outrec[iVar10] = (char)local_84 + '0';
                }
                else {
                  if (bVar5 == 0) {
                    if (iVar10 < 8) {
                      memset(outrec + iVar10,0x20,(ulong)(7 - iVar10) + 1);
                    }
                    return *status;
                  }
                  if ((bVar5 == 0x6e) && (local_70 != 0)) {
                    outrec[iVar10] = (byte)local_70 | 0x30;
                  }
                  else if ((bVar5 == 0x6d) && (local_74 != 0)) {
                    outrec[iVar10] = (byte)local_74 | 0x30;
                  }
                  else if ((bVar5 == 0x6c) && (-1 < (int)local_88)) {
                    if (0 < (int)local_88) {
                      uVar6 = 1;
                      do {
                        uVar6 = uVar6 * 10;
                      } while (0 < (int)(local_88 / uVar6));
                      pbVar12 = (byte *)(outrec + iVar10);
                      do {
                        uVar8 = (ulong)local_88 / ((ulong)uVar6 / 10);
                        *pbVar12 = (char)uVar8 + (char)(uVar8 / 10) * -10 | 0x30;
                        pbVar12 = pbVar12 + 1;
                        iVar10 = iVar10 + 1;
                        bVar16 = 99 < uVar6;
                        uVar6 = uVar6 / 10;
                      } while (bVar16);
                    }
                    iVar10 = iVar10 + -1;
                  }
                  else {
                    if (bVar5 == 0x61) {
                      bVar5 = local_89;
                    }
                    outrec[iVar10] = bVar5;
                  }
                }
                iVar10 = iVar10 + 1;
                bVar5 = pbVar1[lVar11 + 1];
                lVar11 = lVar11 + 1;
              } while( true );
            }
          }
        }
      }
    }
  }
  return iVar10;
}

Assistant:

int fits_translate_pixkeyword(
      char *inrec,        /* I - input string */
      char *outrec,       /* O - output converted string, or */
                          /*     a null string if input does not  */
                          /*     match any of the patterns */
      char *patterns[][2],/* I - pointer to input / output string */
                          /*     templates */
      int npat,           /* I - number of templates passed */
      int naxis,          /* I - number of columns to be binned */
      int *colnum,       /* I - numbers of the columns to be binned */
      int *pat_num,       /* O - matched pattern number (0 based) or -1 */
      int *i,
      int *j,
      int *n,
      int *m,
      int *l,
      int *status)        /* IO - error status */
      
/* 

Translate a keyword name to a new name, based on a set of patterns.
The user passes an array of patterns to be matched.  Input pattern
number i is pattern[i][0], and output pattern number i is
pattern[i][1].  Keywords are matched against the input patterns.  If a
match is found then the keyword is re-written according to the output
pattern.

Order is important.  The first match is accepted.  The fastest match
will be made when templates with the same first character are grouped
together.

Several characters have special meanings:

     i,j - single digits, preserved in output template
     n, m - column number of one or more digits, preserved in output template
     k - generic number of one or more digits, preserved in output template
     a - coordinate designator, preserved in output template
     # - number of one or more digits
     ? - any character
     * - only allowed in first character position, to match all
         keywords; only useful as last pattern in the list

i, j, n, and m are returned by the routine.

For example, the input pattern "iCTYPn" will match "1CTYP5" (if n_value
is 5); the output pattern "CTYPEi" will be re-written as "CTYPE1".
Notice that "i" is preserved.

The following output patterns are special

Special output pattern characters:

    "-" - do not copy a keyword that matches the corresponding input pattern

    "+" - copy the input unchanged

The inrec string could be just the 8-char keyword name, or the entire 
80-char header record.  Characters 9 = 80 in the input string simply get
appended to the translated keyword name.

If n_range = 0, then only keywords with 'n' equal to n_value will be 
considered as a pattern match.  If n_range = +1, then all values of 
'n' greater than or equal to n_value will be a match, and if -1, 
then values of 'n' less than or equal to n_value will match.

*/

{
    int i1 = 0, j1 = 0, val;
    int fac, nval = 0, mval = 0, lval = 0;
    char a = ' ';
    char oldp;
    char c, s;
    int ip, ic, pat, pass = 0, firstfail;
    char *spat;

    if (*status > 0)
        return(*status);

    if ((inrec == 0) || (outrec == 0)) 
      return (*status = NULL_INPUT_PTR);

    *outrec = '\0';
    if (*inrec == '\0') return 0;

    oldp = '\0';
    firstfail = 0;

    /* ===== Pattern match stage */
    for (pat=0; pat < npat; pat++) {

      spat = patterns[pat][0];
      
      i1 = 0; j1 = 0;   a = ' ';  /* Initialize the place-holders */
      pass = 0;
      
      /* Pass the wildcard pattern */
      if (spat[0] == '*') { 
	pass = 1;
	break;
      }
      
      /* Optimization: if we have seen this initial pattern character before,
	 then it must have failed, and we can skip the pattern */
      if (firstfail && spat[0] == oldp) continue;
      oldp = spat[0];

      /* 
	 ip = index of pattern character being matched
	 ic = index of keyname character being matched
	 firstfail = 1 if we fail on the first characteor (0=not)
      */
      
      for (ip=0, ic=0, firstfail=1;
	   (spat[ip]) && (ic < 8);
	   ip++, ic++, firstfail=0) {
	c = inrec[ic];
	s = spat[ip];

	if (s == 'i') {
	  /* Special pattern: 'i' placeholder */
	  if (isdigit(c)) { i1 = c - '0'; pass = 1;}
	} else if (s == 'j') {
	  /* Special pattern: 'j' placeholder */
	  if (isdigit(c)) { j1 = c - '0'; pass = 1;}
	} else if ((s == 'n')||(s == 'm')||(s == 'l')||(s == '#')) {
	  /* Special patterns: multi-digit number */
          val = 0;
	  pass = 0;
	  if (isdigit(c)) {
	    pass = 1;  /* NOTE, could fail below */
	    
	    /* Parse decimal number */
	    while (ic<8 && isdigit(c)) { 
	      val = val*10 + (c - '0');
	      ic++; c = inrec[ic];
	    }
	    ic--; c = inrec[ic];

	    if (s == 'n' || s == 'm') { 
	      
	      /* Is it a column number? */
	      if ( val >= 1 && val <= 999) {
	         
		 if (val == colnum[0])
		     val = 1; 
		 else if (val == colnum[1]) 
		     val = 2; 
		 else if (val == colnum[2]) 
		     val = 3; 
		 else if (val == colnum[3]) 
		     val = 4; 
		 else {
		     pass = 0;
		     val = 0; 
		 }

	         if (s == 'n')
		    nval = val;
		 else
		    mval = val;
 
              } else {
		  pass = 0;
              }
	    } else if (s == 'l') {
	      /* Generic number */
	      lval = val; 
	    }
	  }
	} else if (s == 'a') {
	  /* Special pattern: coordinate designator */
	  if (isupper(c) || c == ' ') { a = c; pass = 1;} 
	} else if (s == '?') {
	  /* Match any individual character */
	  pass = 1;
	} else if (c == s) {
	  /* Match a specific character */
	  pass = 1;
	} else {
	  /* FAIL */
	  pass = 0;
	}
	
	if (!pass) break;
      }
      

      /* Must pass to the end of the keyword.  No partial matches allowed */
      if (pass && (ic >= 8 || inrec[ic] == ' ')) break;
    }


    /* Transfer the pattern-matched numbers to the output parameters */
    if (i) { *i = i1; }
    if (j) { *j = j1; }
    if (n) { *n = nval; }
    if (m) { *m = mval; }
    if (l) { *l = lval; }
    if (pat_num) { *pat_num = pat; }

    /* ===== Keyword rewriting and output stage */
    spat = patterns[pat][1];

    /* Return case: no match, or explicit deletion pattern */
    if (pass == 0 || spat[0] == '\0' || spat[0] == '-') return 0;

    /* A match: we start by copying the input record to the output */
    strcpy(outrec, inrec);

    /* Return case: return the input record unchanged */
    if (spat[0] == '+') return 0;

    /* Final case: a new output pattern */
    for (ip=0, ic=0; spat[ip]; ip++, ic++) {
      s = spat[ip];
      if (s == 'i') {
	outrec[ic] = (i1+'0');
      } else if (s == 'j') {
	outrec[ic] = (j1+'0');
      } else if (s == 'n' && nval > 0) {
	  for (fac = 1; (nval/fac) > 0; fac *= 10);
	  fac /= 10;
	  while(fac > 0) {
	    outrec[ic] = ((nval/fac) % 10) + '0';
	    fac /= 10;
	    ic ++;
	  }
	  ic--;
      } else if (s == 'm' && mval > 0) {
	  for (fac = 1; (mval/fac) > 0; fac *= 10);
	  fac /= 10;
	  while(fac > 0) {
	    outrec[ic] = ((mval/fac) % 10) + '0';
	    fac /= 10;
	    ic ++;
	  }
	  ic--;
      } else if (s == 'l' && lval >= 0) {
	for (fac = 1; (lval/fac) > 0; fac *= 10);
	fac /= 10;
	while(fac > 0) {
	  outrec[ic] = ((lval/fac) % 10) + '0';
	  fac /= 10;
	  ic ++;
	}
	ic --;
      } else if (s == 'a') {
	outrec[ic] = a;
      } else {
	outrec[ic] = s;
      }
    }

    /* Pad the keyword name with spaces */
    for ( ; ic<8; ic++) { outrec[ic] = ' '; }

    return(*status);
}